

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int)>::Invoke
          (FunctionMocker<int_(int,_int,_int,_int)> *this,int args,int args_1,int args_2,int args_3)

{
  Result RVar1;
  UntypedActionResultHolderBase *pUVar2;
  long lVar3;
  bool bVar4;
  ArgumentTuple tuple;
  GTestLog local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_20 = args_3;
  local_1c = args_2;
  local_18 = args_1;
  local_14 = args;
  pUVar2 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&local_20);
  if (pUVar2 == (UntypedActionResultHolderBase *)0x0) {
    bVar4 = true;
  }
  else {
    lVar3 = __dynamic_cast(pUVar2,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<int>::typeinfo,0);
    bVar4 = lVar3 != 0;
  }
  bVar4 = IsTrue(bVar4);
  if (!bVar4) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x451);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog(&local_24);
  }
  RVar1 = *(Result *)&pUVar2[1]._vptr_UntypedActionResultHolderBase;
  (*pUVar2->_vptr_UntypedActionResultHolderBase[1])(pUVar2);
  return RVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }